

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O1

void __thiscall
gimage::RAWImageIO::loadHeader(RAWImageIO *this,char *name,long *width,long *height,int *depth)

{
  int iVar1;
  IOException *this_00;
  long *plVar2;
  size_type *psVar3;
  bool msbfirst;
  int type;
  long *in_stack_ffffffffffffff48;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar1 != '\0') {
    (anonymous_namespace)::readRAWHeader_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)name,&stack0xffffffffffffff4c,
               (int *)&stack0xffffffffffffff4b,(bool *)width,height,in_stack_ffffffffffffff48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *depth = 1;
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_90,name,(allocator *)&stack0xffffffffffffff4a);
  std::operator+(&local_70,"Can only load RAW image (",&local_90);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_b0);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void RAWImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  int  type;
  bool msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  readRAWHeader(name, type, msbfirst, width, height);
  depth=1;
}